

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng64.c
# Opt level: O1

void dss_random64(long *tgt,long nLow,long nHigh,long nStream)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  lVar5 = nHigh;
  if (nLow < nHigh) {
    lVar5 = nLow;
  }
  lVar6 = nLow - nHigh;
  if (nLow - nHigh == 0 || nLow < nHigh) {
    lVar6 = -(nLow - nHigh);
  }
  lVar3 = 0;
  if ((ulong)nStream < 0x30) {
    lVar3 = nStream;
  }
  lVar2 = Seed[lVar3].value;
  uVar4 = lVar2 * 0x5851f42d4c957f2d;
  uVar1 = uVar4 + 1;
  Seed[lVar3].value = uVar1;
  uVar4 = ~uVar4;
  if (-1 < lVar2) {
    uVar4 = uVar1;
  }
  *tgt = (long)uVar4 % (lVar6 + 1) + lVar5;
  Seed[lVar3].usage = Seed[lVar3].usage + 1;
  Seed[lVar3].nCalls = Seed[lVar3].nCalls + 1;
  return;
}

Assistant:

void
dss_random64(DSS_HUGE *tgt, DSS_HUGE nLow, DSS_HUGE nHigh, long nStream)
{
    DSS_HUGE            nTemp;

    if (nStream < 0 || nStream > MAX_STREAM)
        nStream = 0;

    if (nLow > nHigh)
    {
        nTemp = nLow;
        nLow = nHigh;
        nHigh = nTemp;
    }

    Seed[nStream].value = NextRand64(Seed[nStream].value);
    nTemp = Seed[nStream].value;
    if (nTemp < 0) 
	nTemp = -nTemp;
    nTemp %= (nHigh - nLow + 1);
    *tgt = nLow + nTemp;
    Seed[nStream].usage += 1;
#ifdef RNG_TEST
   Seed[nStream].nCalls += 1;
#endif

	return;
}